

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O1

int Gia_ObjComputeEdgeDelay2
              (Gia_Man_t *p,int iObj,Vec_Int_t *vDelay,Vec_Int_t *vEdge1,Vec_Int_t *vEdge2,
              Vec_Int_t *vFanMax1,Vec_Int_t *vFanMax2,Vec_Int_t *vCountMax)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  Vec_Wec_t *pVVar8;
  int iVar9;
  uint *puVar10;
  int iVar11;
  long lVar12;
  int *piVar13;
  uint *puVar14;
  long lVar15;
  uint *puVar16;
  
  if ((iObj < 0) || (vEdge1->nSize <= iObj)) goto LAB_001f8ec3;
  piVar13 = vEdge1->pArray;
  piVar13[(uint)iObj] = 0;
  if (vEdge2->nSize <= iObj) goto LAB_001f8ec3;
  piVar3 = vEdge2->pArray;
  piVar3[(uint)iObj] = 0;
  if ((vDelay->nSize <= iObj) || (vCountMax->nSize <= iObj)) goto LAB_001f8da5;
  piVar4 = vDelay->pArray;
  iVar9 = piVar4[(uint)iObj];
  piVar5 = vCountMax->pArray;
  if (iVar9 == 0) {
    iVar9 = 0;
  }
  else {
    puVar10 = (uint *)(piVar13 + (uint)iObj);
    puVar16 = (uint *)(piVar3 + (uint)iObj);
    if (piVar5[(uint)iObj] == 2) {
      if ((vFanMax1->nSize <= iObj) || (vFanMax2->nSize <= iObj)) goto LAB_001f8da5;
      uVar1 = vFanMax1->pArray[(uint)iObj];
      if (((int)uVar1 < 0) || ((vEdge1->nSize <= (int)uVar1 || (vEdge2->nSize <= (int)uVar1))))
      goto LAB_001f8da5;
      uVar2 = vFanMax2->pArray[(uint)iObj];
      if (((int)uVar2 < 0) || ((vEdge1->nSize <= (int)uVar2 || (vEdge2->nSize <= (int)uVar2))))
      goto LAB_001f8da5;
      if ((0 < piVar13[uVar1] && 0 < piVar3[uVar1]) || (0 < piVar13[uVar2] && 0 < piVar3[uVar2]))
      goto LAB_001f8cb2;
      piVar6 = piVar13;
      if ((piVar13[uVar1] == 0) || (piVar6 = piVar3, piVar3[uVar1] == 0)) {
        piVar6[uVar1] = iObj;
      }
      if (vEdge1->nSize <= (int)uVar2) goto LAB_001f8da5;
      piVar13 = piVar13 + uVar2;
      if (*piVar13 == 0) {
LAB_001f8c4f:
        *piVar13 = iObj;
      }
      else {
        if (vEdge2->nSize <= (int)uVar2) goto LAB_001f8da5;
        piVar13 = piVar3 + uVar2;
        if (*piVar13 == 0) goto LAB_001f8c4f;
      }
      if (vEdge1->nSize <= iObj) goto LAB_001f8da5;
      puVar14 = puVar10;
      if (*puVar10 == 0) {
LAB_001f8c7d:
        *puVar14 = uVar1;
      }
      else {
        if (vEdge2->nSize <= iObj) goto LAB_001f8da5;
        puVar14 = puVar16;
        if (*puVar16 == 0) goto LAB_001f8c7d;
      }
      if (vEdge1->nSize <= iObj) goto LAB_001f8da5;
      if (*puVar10 != 0) {
        if (vEdge2->nSize <= iObj) goto LAB_001f8da5;
        puVar10 = puVar16;
        if (*puVar16 != 0) goto LAB_001f8cb0;
      }
      *puVar10 = uVar2;
    }
    else {
      if (piVar5[(uint)iObj] != 1) goto LAB_001f8cb2;
      if (vFanMax1->nSize <= iObj) goto LAB_001f8da5;
      uVar1 = vFanMax1->pArray[(uint)iObj];
      lVar12 = (long)(int)uVar1;
      if (((lVar12 < 0) || (vEdge1->nSize <= (int)uVar1)) || (vEdge2->nSize <= (int)uVar1))
      goto LAB_001f8da5;
      if (0 < piVar13[lVar12] && 0 < piVar3[lVar12]) goto LAB_001f8cb2;
      if ((piVar13[lVar12] == 0) || (piVar13 = piVar3, piVar3[lVar12] == 0)) {
        piVar13[lVar12] = iObj;
      }
      if (vEdge1->nSize <= iObj) goto LAB_001f8da5;
      if (*puVar10 == 0) {
LAB_001f8bfa:
        *puVar10 = uVar1;
      }
      else {
        if (vEdge2->nSize <= iObj) goto LAB_001f8da5;
        puVar10 = puVar16;
        if (*puVar16 == 0) goto LAB_001f8bfa;
      }
    }
LAB_001f8cb0:
    iVar9 = iVar9 + -1;
  }
LAB_001f8cb2:
  if (vDelay->nSize <= iObj) {
LAB_001f8ec3:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  piVar4[(uint)iObj] = iVar9;
  pVVar7 = p->vMapping;
  if (pVVar7 == (Vec_Int_t *)0x0) {
LAB_001f8dc4:
    pVVar8 = p->vMapping2;
    if (iObj < pVVar8->nSize) {
      pVVar7 = pVVar8->pArray;
      if (pVVar7[(uint)iObj].nSize == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                      ,0x235,
                      "int Gia_ObjComputeEdgeDelay2(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (iObj < pVVar8->nSize) {
        lVar12 = 0;
        do {
          if (pVVar7[(uint)iObj].nSize <= lVar12) {
            return iVar9;
          }
          if (pVVar7[(uint)iObj].nSize <= lVar12) goto LAB_001f8da5;
          iVar11 = pVVar7[(uint)iObj].pArray[lVar12];
          lVar15 = (long)iVar11;
          if ((lVar15 < 0) || (vDelay->nSize <= iVar11)) goto LAB_001f8da5;
          if (iVar9 < piVar4[lVar15]) {
            if (piVar4[lVar15] == iVar9 + 1) {
              if (vFanMax2->nSize <= iVar11) goto LAB_001f8ec3;
              vFanMax2->pArray[lVar15] = iObj;
              if (vCountMax->nSize <= iVar11) {
LAB_001f8ee2:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
              }
              piVar5[lVar15] = piVar5[lVar15] + 1;
            }
          }
          else {
            piVar4[lVar15] = iVar9 + 1;
            if ((vFanMax1->nSize <= iVar11) ||
               (vFanMax1->pArray[lVar15] = iObj, vCountMax->nSize <= iVar11)) goto LAB_001f8ec3;
            piVar5[lVar15] = 1;
          }
          lVar12 = lVar12 + 1;
        } while (iObj < pVVar8->nSize);
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  if (iObj < pVVar7->nSize) {
    piVar13 = pVVar7->pArray;
    if (piVar13[(uint)iObj] == 0) goto LAB_001f8dc4;
    iVar11 = pVVar7->nSize;
    if (iObj < iVar11) {
      lVar12 = 0;
      while( true ) {
        lVar15 = (long)piVar13[(uint)iObj];
        if ((lVar15 < 0) || (iVar11 <= piVar13[(uint)iObj])) break;
        if (piVar13[lVar15] <= lVar12) {
          return iVar9;
        }
        iVar11 = piVar13[lVar15 + lVar12 + 1];
        lVar15 = (long)iVar11;
        if ((lVar15 < 0) || (vDelay->nSize <= iVar11)) break;
        if (iVar9 < piVar4[lVar15]) {
          if (piVar4[lVar15] == iVar9 + 1) {
            if (vFanMax2->nSize <= iVar11) goto LAB_001f8ec3;
            vFanMax2->pArray[lVar15] = iObj;
            if (vCountMax->nSize <= iVar11) goto LAB_001f8ee2;
            piVar5[lVar15] = piVar5[lVar15] + 1;
          }
        }
        else {
          piVar4[lVar15] = iVar9 + 1;
          if ((vFanMax1->nSize <= iVar11) ||
             (vFanMax1->pArray[lVar15] = iObj, vCountMax->nSize <= iVar11)) goto LAB_001f8ec3;
          piVar5[lVar15] = 1;
        }
        lVar12 = lVar12 + 1;
        iVar11 = pVVar7->nSize;
        if (iVar11 <= iObj) break;
      }
    }
  }
LAB_001f8da5:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_ObjComputeEdgeDelay2( Gia_Man_t * p, int iObj, Vec_Int_t * vDelay, Vec_Int_t * vEdge1, Vec_Int_t * vEdge2, Vec_Int_t * vFanMax1, Vec_Int_t * vFanMax2, Vec_Int_t * vCountMax )
{
    int i, iFan, DelayFanin, Status1, Status2;
    int DelayMax = 0, nCountMax = 0;
    int iFanMax1 = -1, iFanMax2 = -1;
    Vec_IntWriteEntry(vEdge1, iObj, 0);
    Vec_IntWriteEntry(vEdge2, iObj, 0);
    // analyze this node
    DelayMax = Vec_IntEntry( vDelay, iObj );
    nCountMax = Vec_IntEntry( vCountMax, iObj );
    if ( DelayMax == 0 )
    {}
    else if ( nCountMax == 1 )
    {
        iFanMax1 = Vec_IntEntry( vFanMax1, iObj );
        Status1 = Gia_ObjEdgeCount( iFanMax1, vEdge1, vEdge2 );
        if ( Status1 <= 1 )
        {
            Gia_ObjEdgeAdd( iFanMax1, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax1, vEdge1, vEdge2 );
            DelayMax--;
        }
    }
    else if ( nCountMax == 2 )
    {
        iFanMax1 = Vec_IntEntry( vFanMax1, iObj );
        iFanMax2 = Vec_IntEntry( vFanMax2, iObj );
        Status1 = Gia_ObjEdgeCount( iFanMax1, vEdge1, vEdge2 );
        Status2 = Gia_ObjEdgeCount( iFanMax2, vEdge1, vEdge2 );
        if ( Status1 <= 1 && Status2 <= 1 )
        {
            Gia_ObjEdgeAdd( iFanMax1, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iFanMax2, iObj, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax1, vEdge1, vEdge2 );
            Gia_ObjEdgeAdd( iObj, iFanMax2, vEdge1, vEdge2 );
            DelayMax--;
        }
    }
    Vec_IntWriteEntry( vDelay, iObj, DelayMax );
    // computed DelayMax at this point
    if ( Gia_ManHasMapping(p) && Gia_ObjIsLut(p, iObj) )
    {
        Gia_LutForEachFanin( p, iObj, iFan, i )
        {
            DelayFanin = Vec_IntEntry( vDelay, iFan );
            if ( DelayFanin < DelayMax + 1 )
            {
                Vec_IntWriteEntry( vDelay, iFan, DelayMax + 1 );
                Vec_IntWriteEntry( vFanMax1, iFan, iObj );
                Vec_IntWriteEntry( vCountMax, iFan, 1 );
            }
            else if ( DelayFanin == DelayMax + 1 )
            {
                Vec_IntWriteEntry( vFanMax2, iFan, iObj );
                Vec_IntAddToEntry( vCountMax, iFan, 1 );
            }
        }
    }
    else if ( Gia_ObjIsLut2(p, iObj) )
    {
        Gia_LutForEachFanin2( p, iObj, iFan, i )
        {
            DelayFanin = Vec_IntEntry( vDelay, iFan );
            if ( DelayFanin < DelayMax + 1 )
            {
                Vec_IntWriteEntry( vDelay, iFan, DelayMax + 1 );
                Vec_IntWriteEntry( vFanMax1, iFan, iObj );
                Vec_IntWriteEntry( vCountMax, iFan, 1 );
            }
            else if ( DelayFanin == DelayMax + 1 )
            {
                Vec_IntWriteEntry( vFanMax2, iFan, iObj );
                Vec_IntAddToEntry( vCountMax, iFan, 1 );
            }
        }
    }
    else assert( 0 );
    return DelayMax;
}